

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_return::~statement_return(statement_return *this)

{
  tree_type<cs::token_base_*>::~tree_type(&this->mTree);
  statement_base::~statement_base(&this->super_statement_base);
  return;
}

Assistant:

statement_return() = delete;